

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_FloodZone(sector_t_conflict *sec,int zonenum)

{
  line_t_conflict *plVar1;
  sector_t_conflict *sec_00;
  long lVar2;
  
  if (((uint)sec->ZoneNumber != zonenum) && (sec->ZoneNumber = (WORD)zonenum, 0 < sec->linecount)) {
    lVar2 = 0;
    do {
      plVar1 = sec->lines[lVar2];
      if ((plVar1->sidedef[1] != (side_t *)0x0) && ((plVar1->flags & 0x10000) == 0)) {
        sec_00 = plVar1->frontsector;
        if (sec_00 == sec) {
          sec_00 = plVar1->backsector;
          if (sec_00 == (sector_t_conflict *)0x0) {
            __assert_fail("check->backsector != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_setup.cpp"
                          ,0x31b,"void P_FloodZone(sector_t *, int)");
          }
        }
        else if (sec_00 == (sector_t_conflict *)0x0) {
          __assert_fail("check->frontsector != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_setup.cpp"
                        ,800,"void P_FloodZone(sector_t *, int)");
        }
        if ((uint)sec_00->ZoneNumber != zonenum) {
          P_FloodZone(sec_00,zonenum);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < sec->linecount);
  }
  return;
}

Assistant:

void P_FloodZone (sector_t *sec, int zonenum)
{
	int i;

	if (sec->ZoneNumber == zonenum)
		return;

	sec->ZoneNumber = zonenum;

	for (i = 0; i < sec->linecount; ++i)
	{
		line_t *check = sec->lines[i];
		sector_t *other;

		if (check->sidedef[1] == NULL || (check->flags & ML_ZONEBOUNDARY))
			continue;

		if (check->frontsector == sec)
		{
			assert(check->backsector != NULL);
			other = check->backsector;
		}
		else
		{
			assert(check->frontsector != NULL);
			other = check->frontsector;
		}

		if (other->ZoneNumber != zonenum)
			P_FloodZone (other, zonenum);
	}
}